

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3 *psVar2;
  size_t sVar3;
  i64 iS;
  undefined1 auStack_d0 [4];
  int wd;
  DateTime y;
  int iStack_98;
  int nDay;
  double s;
  sqlite3_str sRes;
  char *zFmt;
  sqlite3 *db;
  size_t j;
  size_t i;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  if (((argc != 0) &&
      (x._40_8_ = argv, sRes._24_8_ = sqlite3_value_text(*argv),
      (uchar *)sRes._24_8_ != (uchar *)0x0)) &&
     (iVar1 = isDate(context,argc + -1,(sqlite3_value **)(x._40_8_ + 8),(DateTime *)&i), iVar1 == 0)
     ) {
    psVar2 = sqlite3_context_db_handle(context);
    sqlite3StrAccumInit((StrAccum *)&s,(sqlite3 *)0x0,(char *)0x0,0,psVar2->aLimit[0]);
    computeJD((DateTime *)&i);
    computeYMD_HMS((DateTime *)&i);
    db = (sqlite3 *)0x0;
    j = 0;
    while( true ) {
      if (*(char *)(sRes._24_8_ + j) == '\0') break;
      if (*(char *)(sRes._24_8_ + j) == '%') {
        if (db < j) {
          sqlite3_str_append((sqlite3_str *)&s,(char *)((long)&db->pVfs + sRes._24_8_),
                             (int)j - (int)db);
        }
        sVar3 = j + 1;
        db = (sqlite3 *)(j + 2);
        j = sVar3;
        switch(*(undefined1 *)(sRes._24_8_ + sVar3)) {
        case 0x25:
          sqlite3_str_appendchar((sqlite3_str *)&s,1,'%');
          break;
        default:
          sqlite3_str_reset((StrAccum *)&s);
          return;
        case 0x48:
          sqlite3_str_appendf((StrAccum *)&s,"%02d",(ulong)(uint)x.M);
          break;
        case 0x4a:
          sqlite3_str_appendf((StrAccum *)&s,"%.16g",(double)(long)i / 86400000.0);
          break;
        case 0x4d:
          sqlite3_str_appendf((StrAccum *)&s,"%02d",(ulong)(uint)x.D);
          break;
        case 0x53:
          sqlite3_str_appendf((StrAccum *)&s,"%02d",(ulong)(uint)(int)(double)x._24_8_);
          break;
        case 0x57:
        case 0x6a:
          memcpy(auStack_d0,&i,0x30);
          y.s._0_1_ = 0;
          y.iJD._4_4_ = 1;
          y.Y = 1;
          computeJD((DateTime *)auStack_d0);
          y._44_4_ = SUB84((long)((i - _auStack_d0) + 43200000) / 86400000,0);
          if (*(char *)(sRes._24_8_ + sVar3) == 'W') {
            sqlite3_str_appendf((StrAccum *)&s,"%02d",
                                (long)((y._44_4_ + 7) - (int)(((long)(i + 43200000) / 86400000) % 7)
                                      ) / 7 & 0xffffffff);
          }
          else {
            sqlite3_str_appendf((StrAccum *)&s,"%03d",(ulong)(y._44_4_ + 1));
          }
          break;
        case 0x59:
          sqlite3_str_appendf((StrAccum *)&s,"%04d",(ulong)(uint)x.iJD);
          break;
        case 100:
          sqlite3_str_appendf((StrAccum *)&s,"%02d",(ulong)(uint)x.Y);
          break;
        case 0x66:
          iStack_98 = x.m;
          nDay = x.tz;
          if (59.999 < (double)x._24_8_) {
            iStack_98 = 0x3b645a1d;
            nDay = 0x404dffdf;
          }
          sqlite3_str_appendf((StrAccum *)&s,"%06.3f",_iStack_98);
          break;
        case 0x6d:
          sqlite3_str_appendf((StrAccum *)&s,"%02d",(ulong)x.iJD._4_4_);
          break;
        case 0x73:
          if (x.s._7_1_ == '\0') {
            sqlite3_str_appendf((StrAccum *)&s,"%lld",(long)i / 1000 + -0x3118a36940);
          }
          else {
            sqlite3_str_appendf((StrAccum *)&s,"%.3f",(double)(long)(i - 0xbfc83e532200) / 1000.0);
          }
          break;
        case 0x77:
          sqlite3_str_appendchar
                    ((sqlite3_str *)&s,1,(char)(((long)(i + 0x7b98a00) / 86400000) % 7) + '0');
        }
      }
      j = j + 1;
    }
    if (db < j) {
      sqlite3_str_append((sqlite3_str *)&s,(char *)((long)&db->pVfs + sRes._24_8_),(int)j - (int)db)
      ;
    }
    sqlite3ResultStrAccum(context,(StrAccum *)&s);
  }
  return;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    switch( zFmt[i] ){
      case 'd': {
        sqlite3_str_appendf(&sRes, "%02d", x.D);
        break;
      }
      case 'f': {
        double s = x.s;
        if( s>59.999 ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'H': {
        sqlite3_str_appendf(&sRes, "%02d", x.h);
        break;
      }
      case 'W': /* Fall thru */
      case 'j': {
        int nDay;             /* Number of days since 1st day of year */
        DateTime y = x;
        y.validJD = 0;
        y.M = 1;
        y.D = 1;
        computeJD(&y);
        nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
        if( zFmt[i]=='W' ){
          int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
          wd = (int)(((x.iJD+43200000)/86400000)%7);
          sqlite3_str_appendf(&sRes,"%02d",(nDay+7-wd)/7);
        }else{
          sqlite3_str_appendf(&sRes,"%03d",nDay+1);
        }
        break;
      }
      case 'J': {
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'w': {
        sqlite3_str_appendchar(&sRes, 1,
                       (char)(((x.iJD+129600000)/86400000) % 7) + '0');
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}